

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

bool __thiscall
soul::heart::Parser::parseStatement(Parser *this,FunctionParseState *state,FunctionBuilder *builder)

{
  bool bVar1;
  char cVar2;
  AdvanceClock *pAVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string name;
  undefined1 local_100 [8];
  _Alloc_hider local_f8;
  undefined1 local_f0 [8];
  undefined1 local_e8 [32];
  undefined1 local_c8 [32];
  CodeLocation local_a8;
  CompileMessage local_98;
  CompileMessage local_60;
  
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"let");
  if (bVar1) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    readVariableIdentifier_abi_cxx11_((string *)(local_e8 + 0x20),this);
    findVariable((Parser *)local_100,(FunctionParseState *)this,(string *)state);
    if (local_100 != (undefined1  [8])0x0) {
      CompileMessageHelpers::createMessage<std::__cxx11::string&>
                ((CompileMessage *)local_100,(CompileMessageHelpers *)0x1,none,0x27b770,
                 local_e8 + 0x20,in_R9);
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,local_100);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_e8._8_8_);
      if (local_100 != (undefined1  [8])local_f0) {
        operator_delete((void *)local_100,(ulong)((long)local_f0 + 1));
      }
    }
    local_100 = (undefined1  [8])0x0;
    local_f8._M_p = (pointer)(local_f0 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_c8._0_8_,(pointer)(local_c8._8_8_ + local_c8._0_8_));
    local_e8[0x10] = true;
    local_e8[0x11] = false;
    parseVariableAssignment(this,state,builder,(AssignmentTarget *)local_100);
    if ((SourceCodeText *)local_f8._M_p != (SourceCodeText *)(local_f0 + 8)) {
LAB_0022ff0e:
      operator_delete(local_f8._M_p,CONCAT71(local_e8._1_7_,local_e8[0]) + 1);
    }
LAB_0022ff1b:
    if ((SourceCodeText *)local_c8._0_8_ == (SourceCodeText *)(local_e8 + 0x30)) {
      return true;
    }
  }
  else {
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matches(&this->
                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ,"write");
    if (bVar1) {
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      skip(&this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          );
      bVar1 = parseWriteStream(this,state,builder);
      return bVar1;
    }
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matches(&this->
                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ,"advance");
    if (bVar1) {
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      skip(&this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          );
      if ((state->function->functionType).type != run) {
        CompileMessageHelpers::createMessage<>
                  ((CompileMessage *)(local_c8 + 0x68),syntax,error,
                   "The advance() function cannot be called inside this function");
        CodeLocation::throwError
                  (&(this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ).location,(CompileMessage *)(local_c8 + 0x68));
      }
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x2585e7);
      local_a8.sourceCode.object =
           (this->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).location.sourceCode.object;
      if (local_a8.sourceCode.object != (SourceCodeText *)0x0) {
        ((local_a8.sourceCode.object)->super_RefCountedObject).refCount =
             ((local_a8.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      local_a8.location.data =
           (this->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).location.location.data;
      pAVar3 = PoolAllocator::allocate<soul::heart::AdvanceClock,soul::CodeLocation>
                         (&((builder->super_BlockBuilder).module)->allocator->pool,
                          (CodeLocation *)(local_c8 + 0x20));
      (*(builder->super_BlockBuilder)._vptr_BlockBuilder[2])(builder,pAVar3);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_a8.sourceCode.object);
      return true;
    }
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matches(&this->
                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ,"call");
    if (bVar1) {
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      skip(&this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          );
      local_f8._M_p = local_f0 + 8;
      local_100 = (undefined1  [8])0x0;
      local_f0 = (undefined1  [8])0x0;
      local_e8[0] = '\0';
      local_e8[0x10] = false;
      local_e8[0x11] = true;
      parseFunctionCall(this,state,builder,(AssignmentTarget *)local_100);
    }
    else {
      bVar1 = matchesAnyIdentifier(this);
      if (!bVar1) {
        return false;
      }
      parseVariableExpression((Parser *)(local_e8 + 0x20),(FunctionParseState *)this);
      if ((SourceCodeText *)local_c8._0_8_ == (SourceCodeText *)0x0) {
        readVariableIdentifier_abi_cxx11_((string *)(local_e8 + 0x20),this);
        local_100 = (undefined1  [8])0x0;
        local_f8._M_p = (pointer)(local_f0 + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,local_c8._0_8_,(pointer)(local_c8._8_8_ + local_c8._0_8_));
        local_e8[0x10] = false;
        local_e8[0x11] = false;
        parseVariableAssignment(this,state,builder,(AssignmentTarget *)local_100);
        if ((SourceCodeText *)local_f8._M_p != (SourceCodeText *)(local_f0 + 8)) goto LAB_0022ff0e;
        goto LAB_0022ff1b;
      }
      cVar2 = (**(code **)(*(_func_int **)local_c8._0_8_ + 0x40))();
      if (cVar2 == '\0') {
        CompileMessageHelpers::createMessage<char_const(&)[2]>
                  ((CompileMessage *)(local_c8 + 0x30),(CompileMessageHelpers *)0x1,none,0x27cd42,
                   "=",(char (*) [2])in_R9);
        CodeLocation::throwError
                  (&(this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ).location,(CompileMessage *)(local_c8 + 0x30));
      }
      local_f8._M_p = local_f0 + 8;
      local_100 = (undefined1  [8])local_c8._0_8_;
      local_f0 = (undefined1  [8])0x0;
      local_e8[0] = '\0';
      local_e8[0x10] = false;
      local_e8[0x11] = false;
      parseVariableAssignment(this,state,builder,(AssignmentTarget *)local_100);
    }
    if ((SourceCodeText *)local_f8._M_p == (SourceCodeText *)(local_f0 + 8)) {
      return true;
    }
    local_c8._16_8_ = CONCAT71(local_e8._1_7_,local_e8[0]);
    local_c8._0_8_ = local_f8._M_p;
  }
  operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  return true;
}

Assistant:

bool parseStatement (FunctionParseState& state, FunctionBuilder& builder)
    {
        if (matchIf ("let"))
        {
            auto name = readVariableIdentifier();

            if (findVariable (state, name) != nullptr)
                throwError (Errors::nameInUse (name));

            parseVariableAssignment (state, builder, { nullptr, name, true, false });
            return true;
        }

        if (matchIf ("write"))
            return parseWriteStream (state, builder);

        if (matchIf ("advance"))
        {
            if (! state.function.functionType.isRun())
                location.throwError (Errors::advanceCannotBeCalledHere());

            expectSemicolon();
            builder.addAdvance (location);
            return true;
        }

        if (matchIf ("call"))
        {
            parseFunctionCall (state, builder, { nullptr, {}, false, true });
            return true;
        }

        if (matchesAnyIdentifier())
        {
            if (auto existingVariableTarget = parseVariableExpression (state))
            {
                if (! existingVariableTarget->isMutable())
                    location.throwError (Errors::operatorNeedsAssignableTarget ("="));

                parseVariableAssignment (state, builder, { existingVariableTarget, {}, false, false });
                return true;
            }

            auto newVariableName = readVariableIdentifier();
            parseVariableAssignment (state, builder, { nullptr, newVariableName, false, false });
            return true;
        }

        return false;
    }